

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

void rhash_md5_final(md5_ctx *ctx,uchar *result)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  
  uVar3 = (uint)ctx->length;
  bVar5 = (byte)(uVar3 << 3);
  uVar3 = uVar3 >> 2 & 0xf;
  ctx->message[uVar3] = 0x80 << (bVar5 & 0x1f) ^ ~(-1 << (bVar5 & 0x1f)) & ctx->message[uVar3];
  if (uVar3 < 0xe) {
    if (uVar3 == 0xd) goto LAB_0023df96;
    iVar4 = uVar3 + 1;
  }
  else {
    if (uVar3 == 0xe) {
      ctx->message[0xf] = 0;
    }
    rhash_md5_process_block(ctx->hash,ctx->message);
    iVar4 = 0;
  }
  memset((void *)((long)ctx->message + (ulong)(uint)(iVar4 * 4)),0,(ulong)(iVar4 * -4 + 0x34) + 4);
LAB_0023df96:
  uVar1 = ctx->length;
  ctx->message[0xe] = (int)uVar1 * 8;
  ctx->message[0xf] = (uint)(uVar1 >> 0x1d);
  rhash_md5_process_block(ctx->hash,ctx->message);
  if (result != (uchar *)0x0) {
    uVar2 = *(undefined8 *)(ctx->hash + 2);
    *(undefined8 *)result = *(undefined8 *)ctx->hash;
    *(undefined8 *)(result + 8) = uVar2;
  }
  return;
}

Assistant:

void rhash_md5_final(md5_ctx* ctx, unsigned char* result)
{
	unsigned index = ((unsigned)ctx->length & 63) >> 2;
	unsigned shift = ((unsigned)ctx->length & 3) * 8;

	/* pad message and run for last block */

	/* append the byte 0x80 to the message */
	ctx->message[index]   &= ~(0xFFFFFFFFu << shift);
	ctx->message[index++] ^= 0x80u << shift;

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			ctx->message[index++] = 0;
		}
		rhash_md5_process_block(ctx->hash, ctx->message);
		index = 0;
	}
	while (index < 14) {
		ctx->message[index++] = 0;
	}
	ctx->message[14] = (unsigned)(ctx->length << 3);
	ctx->message[15] = (unsigned)(ctx->length >> 29);
	rhash_md5_process_block(ctx->hash, ctx->message);

	if (result) le32_copy(result, 0, &ctx->hash, 16);
}